

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

int __thiscall
QTableViewPrivate::heightHintForIndex
          (QTableViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option)

{
  int y;
  int x;
  Data *pDVar1;
  Data *this_00;
  int iVar2;
  QEditorInfo *pQVar3;
  Node<QWidget_*,_QHashDummyValue> *pNVar4;
  int extraout_var;
  QSize QVar5;
  QSize QVar6;
  Span *span;
  long *plVar7;
  int extraout_var_00;
  int iVar8;
  long in_FS_OFFSET;
  QRect QVar9;
  QWidget *editor;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar7 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  pQVar3 = QAbstractItemViewPrivate::editorForIndex(&this->super_QAbstractItemViewPrivate,index);
  pDVar1 = (pQVar3->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    local_40 = (QWidget *)0x0;
  }
  else {
    local_40 = (QWidget *)(pQVar3->widget).wp.value;
    if (((local_40 != (QWidget *)0x0) &&
        (this_00 = (this->super_QAbstractItemViewPrivate).persistent.q_hash.d,
        this_00 != (Data *)0x0)) &&
       (pNVar4 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::
                 findNode<QWidget*>((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)this_00,
                                    &local_40), pNVar4 != (Node<QWidget_*,_QHashDummyValue> *)0x0))
    {
      (**(code **)(*(long *)local_40 + 0x70))();
      if (hint < extraout_var) {
        hint = extraout_var;
      }
      QVar5 = QWidget::minimumSize(local_40);
      QVar6 = QWidget::maximumSize(local_40);
      if (QVar6.ht.m_i.m_i < hint) {
        hint = QVar6.ht.m_i.m_i;
      }
      if (hint <= QVar5.ht.m_i.m_i) {
        hint = QVar5.ht.m_i.m_i;
      }
    }
  }
  if ((this->super_QAbstractItemViewPrivate).wrapItemText == true) {
    iVar2 = QHeaderView::sectionViewportPosition(*(QHeaderView **)(plVar7[1] + 0x588),index->r);
    (option->super_QStyleOption).rect.y1.m_i = iVar2;
    iVar2 = QHeaderView::sectionSize(*(QHeaderView **)(plVar7[1] + 0x588),index->r);
    (option->super_QStyleOption).rect.y2.m_i =
         iVar2 + (option->super_QStyleOption).rect.y1.m_i + (uint)(iVar2 == 0) + -1;
    iVar2 = QHeaderView::sectionViewportPosition(*(QHeaderView **)(plVar7[1] + 0x580),index->c);
    (option->super_QStyleOption).rect.x1.m_i = iVar2;
    iVar2 = QHeaderView::sectionSize(*(QHeaderView **)(plVar7[1] + 0x580),index->c);
    iVar8 = iVar2 + (option->super_QStyleOption).rect.x1.m_i + -1;
    (option->super_QStyleOption).rect.x2.m_i = iVar8;
    if ((QSpanCollection *)
        (this->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this->spans) {
      y = index->r;
      x = index->c;
      span = QSpanCollection::spanAt(&this->spans,x,y);
      if (((span != (Span *)0x0) && (span->m_left == x)) && (span->m_top == y)) {
        QVar9 = visualSpanRect(this,span);
        iVar8 = (QVar9.x2.m_i.m_i - QVar9.x1.m_i) + 1;
        if (iVar8 < iVar2) {
          iVar8 = iVar2;
        }
        iVar8 = (option->super_QStyleOption).rect.x1.m_i + iVar8 + -1;
        (option->super_QStyleOption).rect.x2.m_i = iVar8;
      }
    }
    if (this->showGrid == true) {
      (option->super_QStyleOption).rect.x2.m_i = iVar8 + -1;
    }
  }
  plVar7 = (long *)(**(code **)(*plVar7 + 0x208))(plVar7,index);
  (**(code **)(*plVar7 + 0x68))(plVar7,option,index);
  iVar2 = extraout_var_00;
  if (extraout_var_00 < hint) {
    iVar2 = hint;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QTableViewPrivate::heightHintForIndex(const QModelIndex &index, int hint, QStyleOptionViewItem &option) const
{
    Q_Q(const QTableView);
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().height());
        int min = editor->minimumSize().height();
        int max = editor->maximumSize().height();
        hint = qBound(min, hint, max);
    }

    if (wrapItemText) {// for wrapping boundaries
        option.rect.setY(q->rowViewportPosition(index.row()));
        int height = q->rowHeight(index.row());
        // if the option.height == 0 then q->itemDelegateForIndex(index)->sizeHint(option, index) will be wrong.
        // The option.height == 0 is used to conclude that the text is not wrapped, and hence it will
        // (exactly like widthHintForIndex) return a QSize with a long width (that we don't use) -
        // and the height of the text if it was/is on one line.
        // What we want is a height hint for the current width (and we know that this section is not hidden)
        // Therefore we catch this special situation with:
        if (height == 0)
            height = 1;
        option.rect.setHeight(height);
        option.rect.setX(q->columnViewportPosition(index.column()));
        option.rect.setWidth(q->columnWidth(index.column()));
        if (hasSpans()) {
            auto span = spans.spanAt(index.column(), index.row());
            if (span && span->m_left == index.column() && span->m_top == index.row())
                option.rect.setWidth(std::max(option.rect.width(), visualSpanRect(*span).width()));
        }
        // 1px less space when grid is shown (see drawCell)
        if (showGrid)
            option.rect.setWidth(option.rect.width() - 1);
    }
    hint = qMax(hint, q->itemDelegateForIndex(index)->sizeHint(option, index).height());
    return hint;
}